

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_NtkDfsNets_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vNets)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNext;
  Vec_Ptr_t *vNets_local;
  Abc_Obj_t *pNet_local;
  
  iVar1 = Abc_ObjIsNet(pNet);
  if (iVar1 != 0) {
    iVar1 = Abc_NodeIsTravIdCurrent(pNet);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent(pNet);
      pObj = Abc_ObjFanin0(pNet);
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_2c);
        Abc_NtkDfsNets_rec(pAVar2,vNets);
      }
      for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1)
      {
        pAVar2 = Abc_ObjFanout(pObj,local_2c);
        Vec_PtrPush(vNets,pAVar2);
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsNet(pNet)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                ,0x2e4,"void Abc_NtkDfsNets_rec(Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NtkDfsNets_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vNets )
{
    Abc_Obj_t * pNext;
    Abc_Obj_t * pNode; int i;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return;
    Abc_NodeSetTravIdCurrent( pNet );
    pNode = Abc_ObjFanin0( pNet );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_NtkDfsNets_rec( pNext, vNets );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Vec_PtrPush( vNets, pNext );
}